

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

boolean inside_gas_cloud(void *p1,void *p2)

{
  int iVar1;
  char *pcVar2;
  int local_38;
  long dam;
  monst *mtmp;
  region *reg;
  void *p2_local;
  void *p1_local;
  
  iVar1 = *(int *)((long)p1 + 0x54);
  if (p2 == (void *)0x0) {
    if (((((youmonst.data)->mlet != '7') && (((youmonst.data)->mflags2 & 2) == 0)) &&
        ((youmonst.data)->mlet != '\x16')) &&
       (((youmonst.data != mons + 0x33 && (u.uprops[0x31].intrinsic == 0)) &&
        ((u.uprops[0x31].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x400) == 0)))))) {
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        make_blinded(1,'\0');
      }
      if ((((u.uprops[6].intrinsic == 0) && (u.uprops[6].extrinsic == 0)) &&
          ((youmonst.mintrinsics & 0x20) == 0)) ||
         ((((u.uprops[6].intrinsic & 0x4000000) != 0 && ((u.uprops[6].intrinsic & 0xfbffffff) == 0))
          && ((u.uprops[6].extrinsic == 0 && ((youmonst.mintrinsics & 0x20) == 0)))))) {
        pcVar2 = body_part(0x10);
        pcVar2 = makeplural(pcVar2);
        pline("Something is burning your %s!",pcVar2);
        pline("You cough and spit blood!");
        local_38 = rnd(iVar1);
        if ((((u.uprops[6].intrinsic & 0x4000000) != 0) &&
            ((u.uprops[6].intrinsic & 0xfbffffff) == 0)) &&
           ((u.uprops[6].extrinsic == 0 && ((youmonst.mintrinsics & 0x20) == 0)))) {
          local_38 = (int)(((long)local_38 + 1) / 2);
        }
        losehp(local_38 + 5,"gas cloud",0);
      }
      else {
        pline("You cough!");
      }
    }
  }
  else if ((((*(char *)(*(long *)((long)p2 + 8) + 8) != '7') &&
            ((*(uint *)(*(long *)((long)p2 + 8) + 0x34) & 2) == 0)) &&
           (*(char *)(*(long *)((long)p2 + 8) + 8) != '\x16')) &&
          ((*(long *)((long)p2 + 8) != 0x3c0b50 &&
           ((*(uint *)(*(long *)((long)p2 + 8) + 0x30) & 0x400) == 0)))) {
    if ((viz_array[*(char *)((long)p2 + 0x50)][*(char *)((long)p2 + 0x4f)] & 2U) != 0) {
      pcVar2 = Monnam((monst *)p2);
      pline("%s coughs!",pcVar2);
    }
    setmangry((monst *)p2);
    if (((*(uint *)(*(long *)((long)p2 + 8) + 0x30) & 0x1000) == 0) &&
       ((*(uint *)((long)p2 + 0x60) >> 0x11 & 1) != 0)) {
      *(undefined1 *)((long)p2 + 0x5b) = 1;
      *(uint *)((long)p2 + 0x60) = *(uint *)((long)p2 + 0x60) & 0xfffdffff;
    }
    if ((*(ushort *)((long)p2 + 0x56) & 0x20) != 0) {
      return '\0';
    }
    iVar1 = rnd(iVar1);
    *(int *)((long)p2 + 0x2c) = *(int *)((long)p2 + 0x2c) - (iVar1 + 5);
    if (*(int *)((long)p2 + 0x2c) < 1) {
      if ((*(byte *)((long)p1 + 0x3e) & 2) == 0) {
        killed((monst *)p2);
      }
      else {
        monkilled((monst *)p2,"gas cloud",7);
      }
      if (*(int *)((long)p2 + 0x2c) < 1) {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

boolean inside_gas_cloud(void * p1, void * p2)
{
    struct region *reg;
    struct monst *mtmp;
    long dam;

    reg = (struct region *) p1;
    dam = (long) reg->arg;
    if (p2 == NULL) {		/* This means *YOU* Bozo! */
	if (nonliving(youmonst.data) || Breathless)
	    return FALSE;
	if (!Blind)
	    make_blinded(1L, FALSE);
	if (!FPoison_resistance) {
	    pline("Something is burning your %s!", makeplural(body_part(LUNG)));
	    pline("You cough and spit blood!");
	    dam = rnd(dam);
	    if (PPoison_resistance)
		dam = (dam + 1) / 2;
	    losehp(dam + 5, "gas cloud", KILLED_BY_AN);
	    return FALSE;
	} else {
	    pline("You cough!");
	    return FALSE;
	}
    } else {			/* A monster is inside the cloud */
	mtmp = (struct monst *) p2;

	/* Non living and non breathing monsters are not concerned */
	if (!nonliving(mtmp->data) && !breathless(mtmp->data)) {
	    if (cansee(mtmp->mx, mtmp->my))
		pline("%s coughs!", Monnam(mtmp));
	    setmangry(mtmp);
	    if (haseyes(mtmp->data) && mtmp->mcansee) {
		mtmp->mblinded = 1;
		mtmp->mcansee = 0;
	    }
	    if (resists_poison(mtmp))
		return FALSE;
	    mtmp->mhp -= rnd(dam) + 5;
	    if (mtmp->mhp <= 0) {
		if (heros_fault(reg))
		    killed(mtmp);
		else
		    monkilled(mtmp, "gas cloud", AD_DRST);
		if (mtmp->mhp <= 0) {	/* not lifesaved */
		    return TRUE;
		}
	    }
	}
    }
    return FALSE;		/* Monster is still alive */
}